

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
glu::getExtensions_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,glu *this,Functions *gl,ApiType apiType)

{
  pointer pbVar1;
  deUint32 dVar2;
  char *pcVar3;
  size_t sVar4;
  TestError *pTVar5;
  undefined4 in_register_0000000c;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int numExtensions;
  string local_58;
  char *local_38;
  
  uVar6 = (uint)gl & 0x30f;
  if (uVar6 == 2) {
    if (*(code **)(this + 0xa78) == (code *)0x0) {
      pTVar5 = (TestError *)
               __cxa_allocate_exception(0x38,this,2,CONCAT44(in_register_0000000c,apiType.m_bits));
      tcu::TestError::TestError
                (pTVar5,(char *)0x0,"gl.getString",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                 ,0xbf);
    }
    else {
      pcVar3 = (char *)(**(code **)(this + 0xa78))(0x1f03);
      dVar2 = (**(code **)(this + 0x800))();
      checkError(dVar2,"glGetString(GL_EXTENSIONS)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                 ,0xc2);
      if (pcVar3 != (char *)0x0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        sVar4 = strlen(pcVar3);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar3,pcVar3 + sVar4);
        de::splitString(__return_storage_ptr__,&local_58,'\0');
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == &local_58.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"glGetString(GL_EXTENSIONS) returned null pointer",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                 ,199);
    }
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((*(code **)(this + 0x868) != (code *)0x0) && (*(long *)(this + 0xa80) != 0)) {
    (**(code **)(this + 0x868))(0x821d,&local_58);
    dVar2 = (**(code **)(this + 0x800))();
    checkError(dVar2,"glGetIntegerv(GL_NUM_EXTENSIONS)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
               ,0xd1);
    if (0 < (long)(int)local_58._M_dataplus._M_p) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(__return_storage_ptr__,(long)(int)local_58._M_dataplus._M_p);
      if (0 < (int)local_58._M_dataplus._M_p) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          pcVar3 = (char *)(**(code **)(this + 0xa80))(0x1f03,uVar8 & 0xffffffff);
          dVar2 = (**(code **)(this + 0x800))();
          checkError(dVar2,"glGetStringi(GL_EXTENSIONS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                     ,0xda);
          if (pcVar3 == (char *)0x0) {
            pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar5,"glGetStringi(GL_EXTENSIONS) returned null pointer",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                       ,0xdf);
            __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          pbVar1 = (__return_storage_ptr__->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_38 = *(char **)((long)&pbVar1->_M_string_length + lVar7);
          strlen(pcVar3);
          std::__cxx11::string::_M_replace
                    ((long)&(pbVar1->_M_dataplus)._M_p + lVar7,0,local_38,(ulong)pcVar3);
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x20;
        } while ((long)uVar8 < (long)(int)local_58._M_dataplus._M_p);
      }
    }
    return __return_storage_ptr__;
  }
  pTVar5 = (TestError *)
           __cxa_allocate_exception(0x38,this,uVar6,CONCAT44(in_register_0000000c,apiType.m_bits));
  tcu::TestError::TestError
            (pTVar5,(char *)0x0,"gl.getIntegerv && gl.getStringi",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
             ,0xce);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static std::vector<std::string> getExtensions (const glw::Functions& gl, ApiType apiType)
{
	using std::vector;
	using std::string;

	if (apiType.getProfile() == PROFILE_ES && apiType.getMajorVersion() == 2)
	{
		TCU_CHECK(gl.getString);

		const char*	extStr	= (const char*)gl.getString(GL_EXTENSIONS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetString(GL_EXTENSIONS)");

		if (extStr)
			return de::splitString(extStr);
		else
			throw tcu::TestError("glGetString(GL_EXTENSIONS) returned null pointer", DE_NULL, __FILE__, __LINE__);
	}
	else
	{
		int				numExtensions	= 0;
		vector<string>	extensions;

		TCU_CHECK(gl.getIntegerv && gl.getStringi);

		gl.getIntegerv(GL_NUM_EXTENSIONS, &numExtensions);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_NUM_EXTENSIONS)");

		if (numExtensions > 0)
		{
			extensions.resize(numExtensions);

			for (int ndx = 0; ndx < numExtensions; ndx++)
			{
				const char* const ext = (const char*)gl.getStringi(GL_EXTENSIONS, ndx);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetStringi(GL_EXTENSIONS)");

				if (ext)
					extensions[ndx] = ext;
				else
					throw tcu::TestError("glGetStringi(GL_EXTENSIONS) returned null pointer", DE_NULL, __FILE__, __LINE__);
			}

		}

		return extensions;
	}
}